

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparc.c
# Opt level: O0

void print_insn_detail(cs_insn *ins)

{
  uint8_t *puVar1;
  int iVar2;
  cs_detail *pcVar3;
  char *pcVar4;
  cs_sparc_op *op;
  int i;
  cs_sparc *sparc;
  cs_insn *ins_local;
  
  if (ins->detail != (cs_detail *)0x0) {
    pcVar3 = ins->detail;
    if ((pcVar3->field_6).x86.rex != '\0') {
      printf("\top_count: %u\n",(ulong)(pcVar3->field_6).x86.rex);
    }
    for (op._4_4_ = 0; (int)op._4_4_ < (int)(uint)(pcVar3->field_6).x86.rex; op._4_4_ = op._4_4_ + 1
        ) {
      puVar1 = pcVar3->groups + (long)(int)op._4_4_ * 0xc + 0x1a;
      iVar2 = *(int *)puVar1;
      if (iVar2 == 1) {
        pcVar4 = cs_reg_name(handle,*(uint *)(puVar1 + 4));
        printf("\t\toperands[%u].type: REG = %s\n",(ulong)op._4_4_,pcVar4);
      }
      else if (iVar2 == 2) {
        printf("\t\toperands[%u].type: IMM = 0x%x\n",(ulong)op._4_4_,(ulong)*(uint *)(puVar1 + 4));
      }
      else if (iVar2 == 3) {
        printf("\t\toperands[%u].type: MEM\n",(ulong)op._4_4_);
        if (puVar1[4] != '\0') {
          pcVar4 = cs_reg_name(handle,(uint)puVar1[4]);
          printf("\t\t\toperands[%u].mem.base: REG = %s\n",(ulong)op._4_4_,pcVar4);
        }
        if (puVar1[5] != '\0') {
          pcVar4 = cs_reg_name(handle,(uint)puVar1[5]);
          printf("\t\t\toperands[%u].mem.index: REG = %s\n",(ulong)op._4_4_,pcVar4);
        }
        if (*(int *)(puVar1 + 8) != 0) {
          printf("\t\t\toperands[%u].mem.disp: 0x%x\n",(ulong)op._4_4_,(ulong)*(uint *)(puVar1 + 8))
          ;
        }
      }
    }
    if ((pcVar3->field_6).arm64.cc != ARM64_CC_INVALID) {
      printf("\tCode condition: %u\n",(ulong)(pcVar3->field_6).arm64.cc);
    }
    if ((pcVar3->field_6).arm.vector_size != 0) {
      printf("\tHint code: %u\n",(ulong)(pcVar3->field_6).ppc.bh);
    }
    printf("\n");
  }
  return;
}

Assistant:

static void print_insn_detail(cs_insn *ins)
{
	cs_sparc *sparc;
	int i;

	// detail can be NULL on "data" instruction if SKIPDATA option is turned ON
	if (ins->detail == NULL)
		return;

	sparc = &(ins->detail->sparc);
	if (sparc->op_count)
		printf("\top_count: %u\n", sparc->op_count);

	for (i = 0; i < sparc->op_count; i++) {
		cs_sparc_op *op = &(sparc->operands[i]);
		switch((int)op->type) {
			default:
				break;
			case SPARC_OP_REG:
				printf("\t\toperands[%u].type: REG = %s\n", i, cs_reg_name(handle, op->reg));
				break;
			case SPARC_OP_IMM:
				printf("\t\toperands[%u].type: IMM = 0x%x\n", i, op->imm);
				break;
			case SPARC_OP_MEM:
				printf("\t\toperands[%u].type: MEM\n", i);
				if (op->mem.base != X86_REG_INVALID)
					printf("\t\t\toperands[%u].mem.base: REG = %s\n",
							i, cs_reg_name(handle, op->mem.base));
				if (op->mem.index != X86_REG_INVALID)
					printf("\t\t\toperands[%u].mem.index: REG = %s\n",
							i, cs_reg_name(handle, op->mem.index));
				if (op->mem.disp != 0)
					printf("\t\t\toperands[%u].mem.disp: 0x%x\n", i, op->mem.disp);

				break;
		}
	}

	if (sparc->cc != 0)
		printf("\tCode condition: %u\n", sparc->cc);

	if (sparc->hint != 0)
		printf("\tHint code: %u\n", sparc->hint);

	printf("\n");
}